

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O1

int Cbs2_ManPropagate(Cbs2_Man_t *p,int Level)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  char *pcVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  int local_38;
  int local_34;
  
  do {
    iVar9 = (p->pProp).iHead;
    lVar13 = (long)iVar9;
    iVar11 = (p->pProp).iTail;
    if (iVar9 < iVar11) {
      uVar3 = (p->pProp).pData[lVar13];
      while (uVar3 != 0) {
        lVar13 = lVar13 + 1;
        if ((int)uVar3 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        iVar9 = Cbs2_ManPropagateOne(p,uVar3 >> 1,Level);
        if (iVar9 != 0) {
          iVar11 = 1;
          local_34 = iVar9;
          goto LAB_0071b937;
        }
        iVar11 = (p->pProp).iTail;
        if (iVar11 <= lVar13) break;
        uVar3 = (p->pProp).pData[lVar13];
      }
    }
    (p->pProp).iHead = iVar11;
    local_38 = (p->pJust).iHead;
    iVar9 = (p->pJust).iTail;
    if (local_38 < iVar9) {
      lVar13 = (long)local_38;
      piVar4 = (p->pJust).pData;
      uVar3 = piVar4[lVar13];
      while (uVar3 != 0) {
        lVar13 = lVar13 + 1;
        if (((int)uVar3 < 0) || (p->pAig->nObjs <= (int)uVar3)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar5 = p->pAig->pObjs;
        uVar6 = *(ulong *)(pGVar5 + uVar3);
        uVar10 = (uint)uVar6;
        bVar8 = (~uVar10 & 0x1fffffff) == 0 || (int)uVar10 < 0;
        uVar14 = (uint)(uVar6 >> 0x20);
        if (bVar8) {
LAB_0071b757:
          pGVar5 = pGVar5 + uVar3;
          if (((ulong)pGVar5 & 1) != 0) {
            __assert_fail("!Gia_IsComplement(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                          ,0x412,"int Cbs2_ManPropagateTwo(Cbs2_Man_t *, int, int)");
          }
          if (bVar8) {
            __assert_fail("Gia_ObjIsAnd(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                          ,0x413,"int Cbs2_ManPropagateTwo(Cbs2_Man_t *, int, int)");
          }
          iVar9 = (p->vAssign).nSize;
          if (iVar9 <= (int)uVar3) {
LAB_0071b974:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          pcVar7 = (p->vAssign).pArray;
          if ('\x01' < pcVar7[uVar3]) {
            __assert_fail("Cbs2_VarIsAssigned(p, iVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                          ,0x414,"int Cbs2_ManPropagateTwo(Cbs2_Man_t *, int, int)");
          }
          if (pcVar7[uVar3] != '\0') {
            __assert_fail("Cbs2_VarValue(p, iVar) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                          ,0x415,"int Cbs2_ManPropagateTwo(Cbs2_Man_t *, int, int)");
          }
          uVar10 = uVar3 - (uVar10 & 0x1fffffff);
          if (((((int)uVar10 < 0) || (iVar9 <= (int)uVar10)) ||
              (uVar15 = uVar3 - (uVar14 & 0x1fffffff), (int)uVar15 < 0)) || (iVar9 <= (int)uVar15))
          goto LAB_0071b974;
          cVar1 = pcVar7[uVar10];
          cVar2 = pcVar7[uVar15];
          p->nPropCalls[1] = p->nPropCalls[1] + 1;
          uVar10 = (uint)(uVar6 >> 0x1d) & 1;
          iVar9 = 0;
          if ((uVar10 != (int)cVar1) && (uVar14 = uVar14 >> 0x1d & 1, uVar14 != (int)cVar2)) {
            uVar10 = uVar10 ^ (int)cVar1;
            uVar14 = uVar14 ^ (int)cVar2;
            if ((uVar10 == 1) && (uVar14 == 1)) {
              iVar9 = Cbs2_ManAnalyze(p,Level,uVar3,uVar3 - ((uint)*(ulong *)pGVar5 & 0x1fffffff),
                                      uVar3 - ((uint)(*(ulong *)pGVar5 >> 0x20) & 0x1fffffff));
            }
            else {
              if ((uVar10 != 1) && (uVar14 != 1)) {
                __assert_fail("Value0 == 1 || Value1 == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                              ,0x41e,"int Cbs2_ManPropagateTwo(Cbs2_Man_t *, int, int)");
              }
              if (1 < (int)uVar10) {
                uVar6 = *(ulong *)pGVar5;
                iVar9 = uVar3 - ((uint)uVar6 & 0x1fffffff);
                if (iVar9 < 0) goto LAB_0071ba6c;
                Cbs2_ManAssign(p,((uint)(uVar6 >> 0x1d) & 1) + iVar9 * 2 ^ 1,Level,uVar3,
                               uVar3 - ((uint)(uVar6 >> 0x20) & 0x1fffffff));
              }
              iVar9 = 0;
              if (1 < (int)uVar14) {
                uVar10 = (uint)(*(ulong *)pGVar5 >> 0x20);
                iVar11 = uVar3 - (uVar10 & 0x1fffffff);
                if (iVar11 < 0) {
LAB_0071ba6c:
                  __assert_fail("Var >= 0 && !(c >> 1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12e,"int Abc_Var2Lit(int, int)");
                }
                Cbs2_ManAssign(p,(uVar10 >> 0x1d & 1) + iVar11 * 2 ^ 1,Level,uVar3,
                               uVar3 - ((uint)*(ulong *)pGVar5 & 0x1fffffff));
              }
            }
          }
          if (iVar9 != 0) {
            iVar11 = 1;
            local_34 = iVar9;
            goto LAB_0071b937;
          }
        }
        else {
          uVar15 = uVar3 - (uVar10 & 0x1fffffff);
          if (((int)uVar15 < 0) || (iVar9 = (p->vAssign).nSize, iVar9 <= (int)uVar15))
          goto LAB_0071b974;
          pcVar7 = (p->vAssign).pArray;
          if (pcVar7[uVar15] < '\x02') goto LAB_0071b757;
          uVar15 = uVar3 - (uVar14 & 0x1fffffff);
          if (((int)uVar15 < 0) || (iVar9 <= (int)uVar15)) goto LAB_0071b974;
          if (pcVar7[uVar15] < '\x02') goto LAB_0071b757;
          lVar12 = (long)local_38;
          local_38 = local_38 + 1;
          piVar4[lVar12] = uVar3;
        }
        iVar9 = (p->pJust).iTail;
        if (iVar9 <= lVar13) break;
        piVar4 = (p->pJust).pData;
        uVar3 = piVar4[lVar13];
      }
    }
    iVar11 = 3;
    if (local_38 != iVar9) {
      (p->pJust).iTail = local_38;
      iVar11 = 0;
    }
LAB_0071b937:
    if (iVar11 != 0) {
      if (iVar11 != 1) {
        local_34 = 0;
      }
      return local_34;
    }
  } while( true );
}

Assistant:

int Cbs2_ManPropagate( Cbs2_Man_t * p, int Level )
{
    while ( 1 )
    {
        int i, k, iVar, iLit, hClause;
        Cbs2_QueForEachEntry( p->pProp, iLit, i )
        {
            if ( (hClause = Cbs2_ManPropagateOne( p, Abc_Lit2Var(iLit), Level )) )
                return hClause;
        }
        p->pProp.iHead = p->pProp.iTail;
        k = p->pJust.iHead;
        Cbs2_QueForEachEntry( p->pJust, iVar, i )
        {
            if ( Cbs2_VarIsJust(p, Gia_ManObj(p->pAig, iVar), iVar) )
                p->pJust.pData[k++] = iVar;
            else if ( (hClause = Cbs2_ManPropagateTwo( p, iVar, Level )) )
                return hClause;
        }
        if ( k == p->pJust.iTail )
            break;
        p->pJust.iTail = k;
    }
    return 0;
}